

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# potion.c
# Opt level: O3

boolean make_hallucinated(long xtime,boolean talk,long mask)

{
  char *pcVar1;
  char *pcVar2;
  char *line;
  char *line_00;
  uint uVar3;
  long lVar4;
  char *pcVar5;
  bool bVar6;
  bool bVar7;
  bool bVar8;
  char buf [256];
  char acStack_138 [264];
  
  pcVar2 = acStack_138;
  line = "Everything %s SO boring now.";
  if (xtime != 0) {
    line = "Oh wow!  Everything %s so cosmic!";
  }
  if (u.uprops[0x1e].intrinsic == 0) {
    if ((ublindf != (obj *)0x0) && (ublindf->otyp != 0xed)) goto LAB_0021cad5;
    if (((youmonst.data)->mflags1 & 0x1000) != 0) goto LAB_0021cad0;
    pcVar5 = "looks";
  }
  else {
LAB_0021cad0:
    if (ublindf == (obj *)0x0) {
      pcVar5 = "feels";
    }
    else {
LAB_0021cad5:
      pcVar5 = "feels";
      if (ublindf->oartifact == '\x1d') {
        pcVar5 = "looks";
      }
    }
  }
  if (mask != 0) {
    bVar6 = u.uprops[0x23].intrinsic != 0;
    uVar3 = u.uprops[0x23].intrinsic;
    if (xtime == 0) {
      u.uprops[0x24].extrinsic = u.uprops[0x24].extrinsic | (uint)mask;
    }
    else {
      u.uprops[0x24].extrinsic = u.uprops[0x24].extrinsic & ~(uint)mask;
    }
    goto LAB_0021cb59;
  }
  bVar6 = u.uprops[0x24].extrinsic == 0 && (u.uprops[0x23].intrinsic == 0) == (xtime != 0);
  lVar4 = 0;
  if (0 < xtime) {
    lVar4 = xtime;
  }
  if (0xfffffe < lVar4) {
    lVar4 = 0xffffff;
  }
  uVar3 = (uint)lVar4 | u.uprops[0x23].intrinsic & 0xff000000;
  if ((((talk == '\0') ||
       (u.uprops[0x24].extrinsic == 0 && (u.uprops[0x23].intrinsic == 0) == (xtime != 0))) ||
      (uVar3 != 0)) || (u.uprops[0x23].intrinsic == 0)) goto LAB_0021cb59;
  u.uprops[0x23].intrinsic = uVar3;
  if (((youmonst.data)->mflags1 & 0x1000) != 0) {
    strange_feeling((obj *)0x0,(char *)0x0);
    uVar3 = u.uprops[0x23].intrinsic;
    goto LAB_0021cb59;
  }
  if (u.uprops[0x1e].intrinsic == 0) {
    if ((ublindf != (obj *)0x0) && (ublindf->otyp != 0xed)) goto LAB_0021cc50;
LAB_0021cc56:
    line_00 = "Your vision seems to %s for a moment but is %s now.";
    pcVar2 = "flatten";
    pcVar1 = "normal";
  }
  else {
    if (ublindf != (obj *)0x0) {
LAB_0021cc50:
      if (ublindf->oartifact == '\x1d') goto LAB_0021cc56;
    }
    bVar7 = youmonst.data == mons + 0x17b;
    bVar8 = youmonst.data == mons + 0x1e;
    pcVar1 = body_part(1);
    strcpy(acStack_138,pcVar1);
    if (bVar8 || bVar7) {
      pcVar1 = "twitches";
    }
    else {
      pcVar2 = makeplural(acStack_138);
      pcVar1 = "twitch";
    }
    pcVar1 = pcVar1 + 2;
    line_00 = "Your %s momentarily %s.";
  }
  pline(line_00,pcVar2,pcVar1);
  uVar3 = u.uprops[0x23].intrinsic;
LAB_0021cb59:
  u.uprops[0x23].intrinsic = uVar3;
  if (bVar6 != false) {
    if ((u._1052_1_ & 1) == 0) {
      see_monsters();
      see_objects();
      see_traps();
    }
    else {
      swallowed(0);
    }
    update_inventory();
    iflags.botl = '\x01';
    if (talk != '\0') {
      pline(line,pcVar5);
    }
  }
  return bVar6;
}

Assistant:

boolean make_hallucinated(long xtime, /* nonzero if this is an attempt to turn on hallucination */
			  boolean talk,
			  long mask)  /* nonzero if resistance status should change by mask */
{
	long old = HHallucination;
	boolean changed = 0;
	const char *message, *verb;

	message = (!xtime) ? "Everything %s SO boring now." :
			     "Oh wow!  Everything %s so cosmic!";
	verb = (!Blind) ? "looks" : "feels";

	if (mask) {
	    if (HHallucination) changed = TRUE;

	    if (!xtime) EHalluc_resistance |= mask;
	    else EHalluc_resistance &= ~mask;
	} else {
	    if (!EHalluc_resistance && (!!HHallucination != !!xtime))
		changed = TRUE;
	    set_itimeout(&HHallucination, xtime);

	    /* clearing temporary hallucination without toggling vision */
	    if (!changed && !HHallucination && old && talk) {
		if (!haseyes(youmonst.data)) {
		    strange_feeling(NULL, NULL);
		} else if (Blind) {
		    char buf[BUFSZ];
		    int eyecnt = eyecount(youmonst.data);

		    strcpy(buf, body_part(EYE));
		    pline(eyemsg, (eyecnt == 1) ? buf : makeplural(buf),
			 (eyecnt == 1) ? "itches" : "itch");
		} else {	/* Grayswandir */
		    pline(vismsg, "flatten", "normal");
		}
	    }
	}

	if (changed) {
	    if (u.uswallow) {
		swallowed(0);	/* redraw swallow display */
	    } else {
		/* The see_* routines should be called *before* the pline. */
		see_monsters();
		see_objects();
		see_traps();
	    }

	    /* for perm_inv and anything similar
	    (eg. Qt windowport's equipped items display) */
	    update_inventory();

	    iflags.botl = 1;
	    if (talk) pline(message, verb);
	}
	return changed;
}